

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O1

void __thiscall
TEST_CommandLineArguments_setStrictGroupFilterSameParameter_Test::testBody
          (TEST_CommandLineArguments_setStrictGroupFilterSameParameter_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  TestFilter *pTVar4;
  TestFilter *filter;
  char *pcVar5;
  char *pcVar6;
  undefined1 auStack_78 [16];
  undefined1 local_68 [16];
  TestFilter groupFilter;
  char *argv [2];
  
  argv[0] = "tests.exe";
  argv[1] = "-sggroup";
  pUVar2 = UtestShell::getCurrent();
  bVar1 = TEST_GROUP_CppUTestGroupCommandLineArguments::newArgumentParser
                    (&this->super_TEST_GROUP_CppUTestGroupCommandLineArguments,2,argv);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","newArgumentParser(argc, argv)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
             ,0x12f,pTVar3);
  TestFilter::TestFilter(&groupFilter,"group");
  TestFilter::strictMatching(&groupFilter);
  pTVar4 = CommandLineArguments::getGroupFilters
                     ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
  bVar1 = TestFilter::operator!=(&groupFilter,pTVar4);
  if (bVar1) {
    pTVar4 = CommandLineArguments::getGroupFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    filter = CommandLineArguments::getGroupFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    bVar1 = TestFilter::operator!=(pTVar4,filter);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0x132);
    }
    bVar1 = TestFilter::operator!=(&groupFilter,&groupFilter);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0x132);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom((TestFilter *)local_68);
    pcVar5 = SimpleString::asCharString((SimpleString *)local_68);
    CommandLineArguments::getGroupFilters
              ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    StringFrom((TestFilter *)auStack_78);
    pcVar6 = SimpleString::asCharString((SimpleString *)auStack_78);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0x132,pTVar3);
    SimpleString::~SimpleString((SimpleString *)auStack_78);
    SimpleString::~SimpleString((SimpleString *)local_68);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0x132,pTVar3);
  }
  SimpleString::~SimpleString(&groupFilter.filter_);
  return;
}

Assistant:

TEST(CommandLineArguments, setStrictGroupFilterSameParameter)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "-sggroup" };
    CHECK(newArgumentParser(argc, argv));
    TestFilter groupFilter("group");
    groupFilter.strictMatching();
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}